

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_exception_handler_test.cpp
# Opt level: O1

void __thiscall
StdExceptionCatcher_Tests::std_exception_catcher_catches_bad_alloc_exception::test_method
          (std_exception_catcher_catches_bad_alloc_exception *this)

{
  undefined8 *puVar1;
  GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::exception>_>
  catcher;
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = clock_gettime;
  __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

BOOST_AUTO_TEST_CASE(std_exception_catcher_catches_bad_alloc_exception)
{
   auto catcher = std_exception_handler(EXIT_FAILURE, UnHandler<int>());
   try
   {
      throw_bad_alloc();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(EXIT_FAILURE, catcher.handleException());
   }
}